

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11GlxPlatform.cpp
# Opt level: O1

void __thiscall
tcu::x11::glx::GlxRenderContext::GlxRenderContext
          (GlxRenderContext *this,GlxContextFactory *factory,RenderConfig *config)

{
  GlxVisual *this_00;
  Functions *this_01;
  Display *pDVar1;
  GlxRenderContext *pGVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  deUint32 dVar6;
  deUint32 dVar7;
  deUint32 dVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  GLXContext p_Var14;
  GlxDrawable *pGVar15;
  NotSupportedError *this_02;
  long lVar16;
  GLXFBConfig fbConfig;
  pointer_____offset_0x10___ *ppuVar17;
  bool bVar18;
  int width;
  int numElems;
  GlxVisual local_a0;
  Rank local_88;
  GlxRenderContext *local_78;
  int local_6c;
  int local_68;
  deUint32 local_64;
  int local_60;
  int local_5c;
  long local_58;
  ulong local_50;
  GlxDisplay *local_48;
  GLXFBConfig local_40;
  GlxContextFactory *local_38;
  
  (this->super_RenderContext)._vptr_RenderContext = (_func_int **)&PTR__GlxRenderContext_00271ed0;
  GlxDisplay::GlxDisplay(&this->m_glxDisplay,factory->m_eventState,(char *)0x0);
  pDVar1 = (this->m_glxDisplay).super_XlibDisplay.m_display;
  local_5c = 0;
  local_78 = this;
  local_48 = &this->m_glxDisplay;
  lVar12 = glXGetFBConfigs(pDVar1,*(undefined4 *)(pDVar1 + 0xe0));
  if (lVar12 == 0) {
    this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    TestError::TestError
              ((TestError *)this_02,"Couldn\'t query framebuffer configurations",
               "fbConfigs != DE_NULL",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/platform/X11/tcuX11GlxPlatform.cpp"
               ,0x252);
    ppuVar17 = &TestError::typeinfo;
  }
  else {
    if (local_5c < 1) {
      bVar18 = true;
      fbConfig = (GLXFBConfig)0x0;
    }
    else {
      lVar16 = 0;
      local_50 = 0;
      local_40 = (GLXFBConfig)0x0;
      local_58 = lVar12;
      local_38 = factory;
      do {
        GlxVisual::GlxVisual(&local_a0,local_48,*(GLXFBConfig *)(local_58 + lVar16 * 8));
        if (config->id == -1) {
          lVar12 = 0;
          bVar18 = false;
          do {
            iVar3 = *(int *)((long)&(config->type).super_ApiType.m_bits +
                            *(long *)(&DAT_002203a8 + lVar12));
            if ((iVar3 != -1) &&
               (iVar9 = GlxVisual::getAttrib(&local_a0,*(int *)((long)&s_attribs + lVar12)),
               iVar3 != iVar9)) {
              if (!bVar18) goto LAB_00164407;
              break;
            }
            lVar12 = lVar12 + 0x10;
            bVar18 = lVar12 == 0x80;
          } while (!bVar18);
          uVar5 = 0;
          if ((ulong)config->surfaceType < 4) {
            uVar5 = *(uint *)(&DAT_00220a7c + (ulong)config->surfaceType * 4);
          }
          uVar4 = GlxVisual::getAttrib(&local_a0,0x8010);
          if ((uVar4 & uVar5) != 0) {
            bVar18 = CONCAT44(local_a0.m_visual._4_4_,(int)local_a0.m_visual) != 0 ||
                     config->surfaceType != SURFACETYPE_WINDOW;
            goto LAB_0016418f;
          }
        }
        else {
          iVar3 = GlxVisual::getAttrib(&local_a0,0x8013);
          bVar18 = iVar3 == config->id;
LAB_0016418f:
          if (bVar18) {
            iVar3 = GlxVisual::getAttrib(&local_a0,5);
            if ((iVar3 == 0) || (uVar5 = GlxVisual::getAttrib(&local_a0,0x8011), (uVar5 & 1) == 0))
            {
              uVar13 = 0;
            }
            else {
              local_88.m_value = 0;
              local_88.m_bitsLeft = 0x40;
              local_60 = GlxVisual::getAttrib(&local_a0,0x20);
              dVar6 = GlxVisual::getAttrib(&local_a0,8);
              dVar7 = GlxVisual::getAttrib(&local_a0,9);
              dVar8 = GlxVisual::getAttrib(&local_a0,10);
              local_64 = GlxVisual::getAttrib(&local_a0,0xb);
              local_68 = GlxVisual::getAttrib(&local_a0,0xc);
              local_6c = GlxVisual::getAttrib(&local_a0,0xd);
              if ((int)dVar7 < (int)dVar8) {
                dVar8 = dVar7;
              }
              if ((int)dVar6 < (int)dVar8) {
                dVar8 = dVar6;
              }
              Rank::add(&local_88,1,(uint)(local_60 != 0x800d));
              iVar3 = GlxVisual::getAttrib(&local_a0,0x23);
              Rank::add(&local_88,1,(uint)(iVar3 == 0x8000));
              iVar3 = GlxVisual::getAttrib(&local_a0,6);
              Rank::add(&local_88,1,(uint)(iVar3 == 0));
              iVar3 = GlxVisual::getAttrib(&local_a0,3);
              Rank::add(&local_88,1,(uint)(iVar3 == 0));
              Rank::add(&local_88,1,(uint)(0 < (int)local_64));
              Rank::add(&local_88,1,(uint)(0 < local_68));
              Rank::add(&local_88,1,(uint)(0 < local_6c));
              Rank::add(&local_88,1,(uint)(local_60 != 0x8001));
              dVar6 = local_64;
              if ((int)dVar8 < (int)local_64) {
                dVar6 = dVar8;
              }
              Rank::add(&local_88,4,dVar6);
              Rank::add(&local_88,4,dVar8);
              Rank::add(&local_88,6,local_6c + local_68);
              dVar8 = GlxVisual::getAttrib(&local_a0,0x186a1);
              Rank::sub(&local_88,5,dVar8);
              uVar5 = GlxVisual::getAttrib(&local_a0,0x22);
              Rank::add(&local_88,1,(uint)((uVar5 & 0xfffffffe) == 0x8002));
              uVar13 = local_88.m_value;
            }
            if (local_50 < uVar13) {
              local_40 = *(GLXFBConfig *)(local_58 + lVar16 * 8);
              local_50 = uVar13;
            }
          }
        }
LAB_00164407:
        lVar16 = lVar16 + 1;
      } while (lVar16 < local_5c);
      bVar18 = local_50 == 0;
      lVar12 = local_58;
      fbConfig = local_40;
      factory = local_38;
      this = local_78;
    }
    XFree(lVar12);
    if (!bVar18) {
      this_00 = &this->m_glxVisual;
      GlxVisual::GlxVisual(this_00,local_48,fbConfig);
      (this->m_type).super_ApiType.m_bits = (config->type).super_ApiType.m_bits;
      p_Var14 = GlxVisual::createContext
                          (this_00,factory,&config->type,config->resetNotificationStrategy);
      this->m_GLXContext = p_Var14;
      pGVar15 = createDrawable(this_00,config);
      (this->m_glxDrawable).
      super_UniqueBase<tcu::x11::glx::GlxDrawable,_de::DefaultDeleter<tcu::x11::glx::GlxDrawable>_>.
      m_data.ptr = pGVar15;
      local_a0.m_display._0_4_ = 0;
      (*pGVar15->_vptr_GlxDrawable[3])(pGVar15,&local_a0,0);
      local_58 = CONCAT44(local_58._4_4_,(int)local_a0.m_display);
      pGVar15 = (this->m_glxDrawable).
                super_UniqueBase<tcu::x11::glx::GlxDrawable,_de::DefaultDeleter<tcu::x11::glx::GlxDrawable>_>
                .m_data.ptr;
      local_a0.m_display = (GlxDisplay *)((ulong)local_a0.m_display._4_4_ << 0x20);
      (*pGVar15->_vptr_GlxDrawable[3])(pGVar15,0);
      iVar3 = (int)local_a0.m_display;
      iVar9 = GlxVisual::getAttrib(this_00,8);
      iVar10 = GlxVisual::getAttrib(this_00,9);
      iVar11 = GlxVisual::getAttrib(this_00,10);
      local_a0.m_visual._4_4_ = GlxVisual::getAttrib(this_00,0xb);
      local_a0.m_display = (GlxDisplay *)CONCAT44(iVar10,iVar9);
      local_a0.m_visual._0_4_ = iVar11;
      iVar9 = GlxVisual::getAttrib(this_00,0xc);
      iVar10 = GlxVisual::getAttrib(this_00,0xd);
      iVar11 = GlxVisual::getAttrib(this_00,0x186a1);
      RenderTarget::RenderTarget
                (&local_78->m_renderTarget,(int)local_58,iVar3,(PixelFormat *)&local_a0,iVar9,iVar10
                 ,iVar11);
      pGVar2 = local_78;
      this_01 = &local_78->m_functions;
      glw::Functions::Functions(this_01);
      local_a0.m_display = (GlxDisplay *)&PTR_get_00272008;
      (*(pGVar2->super_RenderContext)._vptr_RenderContext[8])(pGVar2);
      glu::initFunctions(this_01,(FunctionLoader *)&local_a0,
                         (ApiType)((config->type).super_ApiType.m_bits & 0x3ff));
      return;
    }
    this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    NotSupportedError::NotSupportedError
              (this_02,"Requested GLX configuration not found or unusable",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/platform/X11/tcuX11GlxPlatform.cpp"
               ,0x26d);
    ppuVar17 = &NotSupportedError::typeinfo;
  }
  __cxa_throw(this_02,ppuVar17,Exception::~Exception);
}

Assistant:

GlxRenderContext::GlxRenderContext (const GlxContextFactory&	factory,
									const RenderConfig&			config)
	: m_glxDisplay		(factory.getEventState(), DE_NULL)
	, m_glxVisual		(chooseVisual(m_glxDisplay, config))
	, m_type			(config.type)
	, m_GLXContext		(m_glxVisual.createContext(factory, config.type, config.resetNotificationStrategy))
	, m_glxDrawable		(createDrawable(m_glxVisual, config))
	, m_renderTarget	(m_glxDrawable->getWidth(), m_glxDrawable->getHeight(),
						 PixelFormat(m_glxVisual.getAttrib(GLX_RED_SIZE),
									 m_glxVisual.getAttrib(GLX_GREEN_SIZE),
									 m_glxVisual.getAttrib(GLX_BLUE_SIZE),
									 m_glxVisual.getAttrib(GLX_ALPHA_SIZE)),
						 m_glxVisual.getAttrib(GLX_DEPTH_SIZE),
						 m_glxVisual.getAttrib(GLX_STENCIL_SIZE),
						 m_glxVisual.getAttrib(GLX_SAMPLES))
{
	const GlxFunctionLoader loader;
	makeCurrent();
	glu::initFunctions(&m_functions, &loader, config.type.getAPI());
}